

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O3

void TestBufferStream(void)

{
  ostream *poVar1;
  int iVar2;
  string junk;
  undefined **local_238;
  undefined1 local_230;
  undefined8 *local_228;
  long **local_220;
  begin local_218;
  long **local_200;
  long local_1f8;
  long local_1f0;
  long *local_1e8;
  long *local_1e0;
  assertion_result local_1d8;
  const_string local_1c0;
  lazy_ostream local_1b0;
  undefined8 *local_1a0;
  char *local_198;
  ostream os;
  
  local_218.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_218.m_file_name.m_end = "";
  local_218.m_line_num = 0x198;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_238 = (undefined **)CONCAT71(local_238._1_7_,1);
  os.super_ostream._8_8_ = os.super_ostream._8_8_ & 0xffffffffffffff00;
  os.super_ostream._vptr_basic_ostream = (_func_int **)&PTR__lazy_ostream_001dc930;
  os.super_ostream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  os.super_ostream._24_8_ = anon_var_dwarf_a436a;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(lazy_ostream *)&os);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_238);
  makeString_abi_cxx11_(&junk,0x1000);
  avro::ostream::ostream(&os);
  iVar2 = 3;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              (&os.super_ostream,junk._M_dataplus._M_p,junk._M_string_length);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Buffer has ",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bytes\n",7);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1df890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1b937c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1a5;
  local_1b0.m_empty = false;
  local_1b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc7b0;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_1f0 = *(long *)(os.super_ostream._72_8_ + 0xa8);
  local_1e0 = &local_1f0;
  local_1f8 = junk._M_string_length * 3;
  local_1e8 = &local_1f8;
  local_1d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1f0 == local_1f8);
  local_1d8.m_message.px = (element_type *)0x0;
  local_1d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_1c0.m_end = "";
  local_200 = &local_1e0;
  local_218.m_file_name.m_end = (iterator)((ulong)local_218.m_file_name.m_end & 0xffffffffffffff00);
  local_218.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dc7f0;
  local_218.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_220 = &local_1e8;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_001dc7f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d8,&local_1b0,&local_1c0,0x1a5,CHECK,CHECK_EQUAL,2,"buf.size()",&local_218,
             "junk.size() * i",&local_238);
  boost::detail::shared_count::~shared_count(&local_1d8.m_message.pn);
  os.super_ostream._vptr_basic_ostream = (_func_int **)(avro::ostream::vtable + 0x18);
  os.super_ostream._88_8_ = 0x1db8a0;
  os.super_ostream._8_8_ = &PTR__ostreambuf_001db928;
  boost::detail::shared_count::~shared_count((shared_count *)&os.super_ostream.field_0x50);
  os.super_ostream._8_8_ = sysconf;
  std::locale::~locale((locale *)&os.super_ostream.field_0x40);
  std::ios_base::~ios_base((ios_base *)&os.super_ostream.field_0x58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)junk._M_dataplus._M_p != &junk.field_2) {
    operator_delete(junk._M_dataplus._M_p,junk.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestBufferStream()
{
    BOOST_TEST_MESSAGE( "TestBufferStream");

    {
        // write enough bytes to a buffer, to create at least 3 blocks
        std::string junk = makeString(kDefaultBlockSize);
        ostream os;
        int i = 0;
        for(; i < 3; ++i) {
            os << junk;
        }

        const OutputBuffer &buf = os.getBuffer();
        cout << "Buffer has " << buf.size() << " bytes\n";
        BOOST_CHECK_EQUAL(buf.size(), junk.size() * i);
    }
}